

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManBuiltInSimPerformInt(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  word *pwVar3;
  word *pwVar4;
  word *pwVar5;
  word *pInfo1;
  word *pInfo0;
  word *pInfo;
  int w;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  pwVar3 = Gia_ManBuiltInData(p,iObj);
  iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
  pwVar4 = Gia_ManBuiltInData(p,iVar1);
  iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
  pwVar5 = Gia_ManBuiltInData(p,iVar1);
  if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
    __assert_fail("p->fBuiltInSim || p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x323,"void Gia_ManBuiltInSimPerformInt(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ObjFaninC0(pObj_00);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjFaninC1(pObj_00);
    if (iVar1 == 0) {
      for (pInfo._4_4_ = 0; pInfo._4_4_ < p->nSimWords; pInfo._4_4_ = pInfo._4_4_ + 1) {
        pwVar3[pInfo._4_4_] = pwVar4[pInfo._4_4_] & pwVar5[pInfo._4_4_];
      }
    }
    else {
      for (pInfo._4_4_ = 0; pInfo._4_4_ < p->nSimWords; pInfo._4_4_ = pInfo._4_4_ + 1) {
        pwVar3[pInfo._4_4_] = pwVar4[pInfo._4_4_] & (pwVar5[pInfo._4_4_] ^ 0xffffffffffffffff);
      }
    }
  }
  else {
    iVar1 = Gia_ObjFaninC1(pObj_00);
    if (iVar1 == 0) {
      for (pInfo._4_4_ = 0; pInfo._4_4_ < p->nSimWords; pInfo._4_4_ = pInfo._4_4_ + 1) {
        pwVar3[pInfo._4_4_] = (pwVar4[pInfo._4_4_] ^ 0xffffffffffffffff) & pwVar5[pInfo._4_4_];
      }
    }
    else {
      for (pInfo._4_4_ = 0; pInfo._4_4_ < p->nSimWords; pInfo._4_4_ = pInfo._4_4_ + 1) {
        pwVar3[pInfo._4_4_] = (pwVar4[pInfo._4_4_] | pwVar5[pInfo._4_4_]) ^ 0xffffffffffffffff;
      }
    }
  }
  iVar1 = Vec_WrdSize(p->vSims);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2 * p->nSimWords) {
    __assert_fail("Vec_WrdSize(p->vSims) == Gia_ManObjNum(p) * p->nSimWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x336,"void Gia_ManBuiltInSimPerformInt(Gia_Man_t *, int)");
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimPerformInt( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj ); int w;
    word * pInfo  = Gia_ManBuiltInData( p, iObj ); 
    word * pInfo0 = Gia_ManBuiltInData( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pInfo1 = Gia_ManBuiltInData( p, Gia_ObjFaninId1(pObj, iObj) ); 
    assert( p->fBuiltInSim || p->fIncrSim );
    if ( Gia_ObjFaninC0(pObj) )
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
        else 
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = ~pInfo0[w] & pInfo1[w];
    }
    else 
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = pInfo0[w] & ~pInfo1[w];
        else 
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = pInfo0[w] & pInfo1[w];
    }
    assert( Vec_WrdSize(p->vSims) == Gia_ManObjNum(p) * p->nSimWords );
}